

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyIntegerGreaterOrEqual
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference)

{
  float pname;
  bool bVar1;
  qpTestResult qVar2;
  float *pfVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  float local_1c0 [4];
  MessageBuilder local_1b0;
  undefined1 local_2c [8];
  StateQueryMemoryWriteGuard<float> state;
  GLint reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetFloatVerifier *this_local;
  
  state.m_value = (float)reference;
  state.m_postguard = (float)name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float> *)local_2c);
  pname = state.m_postguard;
  pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::operator&
                     ((StateQueryMemoryWriteGuard<float> *)local_2c);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,(GLenum)pname,pfVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float> *)local_2c,testCtx);
  if ((bVar1) &&
     (pfVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_float_
                         ((StateQueryMemoryWriteGuard *)local_2c),
     *pfVar3 < (float)(int)state.m_value)) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [40])"// ERROR: expected greater or equal to ");
    local_1c0[0] = (float)(int)state.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<float> *)local_2c);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyIntegerGreaterOrEqual (tcu::TestContext& testCtx, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat> state;
	glGetFloatv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < GLfloat(reference))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLfloat(reference) << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}